

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::MessageSetItemByteSize
          (Extension *this,int number)

{
  int iVar1;
  int iVar2;
  LogMessage *other;
  size_t sVar3;
  long lVar4;
  RepeatedField<int> *pRVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar6;
  long lVar7;
  void *extraout_RDX;
  ulong uVar8;
  ulong uVar9;
  void *in_RDX;
  ulong uVar10;
  size_t sVar11;
  uint uVar12;
  uint64 uVar13;
  ulong uVar14;
  LogFinisher LStack_59;
  LogMessage LStack_58;
  
  if ((this->type == '\v') && (this->is_repeated != true)) {
    if ((this->field_0xa & 1) == 0) {
      uVar12 = number | 1;
      iVar2 = 0x1f;
      if (uVar12 != 0) {
        for (; uVar12 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar7 = (**(code **)(*(long *)(this->field_0).repeated_string_value + 0x58))
                        ((type_info *)(this->field_0).repeated_string_value,(ulong)uVar12,in_RDX);
      uVar12 = (uint)lVar7 | 1;
      iVar1 = 0x1f;
      if (uVar12 != 0) {
        for (; uVar12 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar11 = (ulong)(iVar2 * 9 + 0x49U >> 6) + 4 + lVar7 + (ulong)(iVar1 * 9 + 0x49U >> 6);
    }
    else {
      sVar11 = 0;
    }
    return sVar11;
  }
  if (this->is_repeated == true) {
    if (this->is_packed != true) {
      sVar11 = WireFormatLite::TagSize(number,(uint)this->type);
      switch(this->type) {
      case '\x01':
      case '\x06':
      case '\x10':
        lVar7 = sVar11 + 8;
        break;
      case '\x02':
      case '\a':
      case '\x0f':
        lVar7 = sVar11 + 4;
        break;
      case '\x03':
        uVar12 = ((this->field_0).repeated_int32_value)->current_size_;
        sVar11 = sVar11 * uVar12;
        uVar10 = 0;
        uVar9 = 0;
        if (0 < (int)uVar12) {
          uVar9 = (ulong)uVar12;
        }
        for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          uVar8 = *(ulong *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                            uVar10 * 8) | 1;
          lVar7 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
            }
          }
          sVar11 = sVar11 + ((int)lVar7 * 9 + 0x49U >> 6);
        }
        return sVar11;
      case '\x04':
        uVar12 = ((this->field_0).repeated_int32_value)->current_size_;
        sVar11 = sVar11 * uVar12;
        uVar10 = 0;
        uVar9 = 0;
        if (0 < (int)uVar12) {
          uVar9 = (ulong)uVar12;
        }
        for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          uVar8 = *(ulong *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                            uVar10 * 8) | 1;
          lVar7 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
            }
          }
          sVar11 = sVar11 + ((int)lVar7 * 9 + 0x49U >> 6);
        }
        return sVar11;
      case '\x05':
        pRVar5 = (this->field_0).repeated_int32_value;
        uVar10 = (ulong)(uint)pRVar5->current_size_;
        sVar11 = sVar11 * uVar10;
        for (lVar7 = 0; lVar7 < (int)uVar10; lVar7 = lVar7 + 1) {
          sVar3 = io::CodedOutputStream::VarintSize32SignExtended
                            (*(int32 *)((long)pRVar5->arena_or_elements_ + lVar7 * 4));
          sVar11 = sVar11 + sVar3;
          pRVar5 = (this->field_0).repeated_int32_value;
          uVar10 = (ulong)(uint)pRVar5->current_size_;
        }
        return sVar11;
      case '\b':
        lVar7 = sVar11 + 1;
        break;
      case '\t':
        pRVar6 = (this->field_0).repeated_string_value;
        uVar10 = (ulong)(uint)(pRVar6->super_RepeatedPtrFieldBase).current_size_;
        sVar11 = sVar11 * uVar10;
        for (lVar7 = 0; lVar7 < (int)uVar10; lVar7 = lVar7 + 1) {
          sVar3 = WireFormatLite::StringSize
                            ((string *)((pRVar6->super_RepeatedPtrFieldBase).rep_)->elements[lVar7])
          ;
          sVar11 = sVar11 + sVar3;
          pRVar6 = (this->field_0).repeated_string_value;
          uVar10 = (ulong)(uint)(pRVar6->super_RepeatedPtrFieldBase).current_size_;
        }
        return sVar11;
      case '\n':
        pRVar6 = (this->field_0).repeated_string_value;
        uVar10 = (ulong)(uint)(pRVar6->super_RepeatedPtrFieldBase).current_size_;
        sVar11 = sVar11 * uVar10;
        for (lVar7 = 0; lVar7 < (int)uVar10; lVar7 = lVar7 + 1) {
          lVar4 = (**(code **)(*((pRVar6->super_RepeatedPtrFieldBase).rep_)->elements[lVar7] + 0x58)
                  )();
          sVar11 = sVar11 + lVar4;
          pRVar6 = (this->field_0).repeated_string_value;
          uVar10 = (ulong)(uint)(pRVar6->super_RepeatedPtrFieldBase).current_size_;
        }
        return sVar11;
      case '\v':
        pRVar6 = (this->field_0).repeated_string_value;
        uVar10 = (ulong)(uint)(pRVar6->super_RepeatedPtrFieldBase).current_size_;
        sVar11 = sVar11 * uVar10;
        for (lVar7 = 0; lVar7 < (int)uVar10; lVar7 = lVar7 + 1) {
          sVar3 = WireFormatLite::MessageSize<google::protobuf::MessageLite>
                            ((MessageLite *)
                             ((pRVar6->super_RepeatedPtrFieldBase).rep_)->elements[lVar7]);
          sVar11 = sVar11 + sVar3;
          pRVar6 = (this->field_0).repeated_string_value;
          uVar10 = (ulong)(uint)(pRVar6->super_RepeatedPtrFieldBase).current_size_;
        }
        return sVar11;
      case '\f':
        pRVar6 = (this->field_0).repeated_string_value;
        uVar10 = (ulong)(uint)(pRVar6->super_RepeatedPtrFieldBase).current_size_;
        sVar11 = sVar11 * uVar10;
        for (lVar7 = 0; lVar7 < (int)uVar10; lVar7 = lVar7 + 1) {
          sVar3 = WireFormatLite::BytesSize
                            ((string *)((pRVar6->super_RepeatedPtrFieldBase).rep_)->elements[lVar7])
          ;
          sVar11 = sVar11 + sVar3;
          pRVar6 = (this->field_0).repeated_string_value;
          uVar10 = (ulong)(uint)(pRVar6->super_RepeatedPtrFieldBase).current_size_;
        }
        return sVar11;
      case '\r':
        uVar12 = ((this->field_0).repeated_int32_value)->current_size_;
        sVar11 = sVar11 * uVar12;
        uVar10 = 0;
        uVar9 = 0;
        if (0 < (int)uVar12) {
          uVar9 = (ulong)uVar12;
        }
        for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          uVar12 = *(uint *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                            uVar10 * 4) | 1;
          iVar2 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> iVar2 == 0; iVar2 = iVar2 + -1) {
            }
          }
          sVar11 = sVar11 + (iVar2 * 9 + 0x49U >> 6);
        }
        return sVar11;
      case '\x0e':
        pRVar5 = (this->field_0).repeated_int32_value;
        uVar10 = (ulong)(uint)pRVar5->current_size_;
        sVar11 = sVar11 * uVar10;
        for (lVar7 = 0; lVar7 < (int)uVar10; lVar7 = lVar7 + 1) {
          sVar3 = io::CodedOutputStream::VarintSize32SignExtended
                            (*(int32 *)((long)pRVar5->arena_or_elements_ + lVar7 * 4));
          sVar11 = sVar11 + sVar3;
          pRVar5 = (this->field_0).repeated_int32_value;
          uVar10 = (ulong)(uint)pRVar5->current_size_;
        }
        return sVar11;
      case '\x11':
        pRVar5 = (this->field_0).repeated_int32_value;
        uVar10 = (ulong)(uint)pRVar5->current_size_;
        sVar11 = sVar11 * uVar10;
        for (lVar7 = 0; lVar7 < (int)uVar10; lVar7 = lVar7 + 1) {
          sVar3 = WireFormatLite::SInt32Size
                            (*(int32 *)((long)pRVar5->arena_or_elements_ + lVar7 * 4));
          sVar11 = sVar11 + sVar3;
          pRVar5 = (this->field_0).repeated_int32_value;
          uVar10 = (ulong)(uint)pRVar5->current_size_;
        }
        return sVar11;
      case '\x12':
        pRVar5 = (this->field_0).repeated_int32_value;
        uVar10 = (ulong)(uint)pRVar5->current_size_;
        sVar11 = sVar11 * uVar10;
        for (lVar7 = 0; lVar7 < (int)uVar10; lVar7 = lVar7 + 1) {
          sVar3 = WireFormatLite::SInt64Size
                            (*(int64 *)((long)pRVar5->arena_or_elements_ + lVar7 * 8));
          sVar11 = sVar11 + sVar3;
          pRVar5 = (this->field_0).repeated_int32_value;
          uVar10 = (ulong)(uint)pRVar5->current_size_;
        }
        return sVar11;
      default:
        return 0;
      }
      return lVar7 * (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_;
    }
    switch((uint)this->type) {
    case 1:
    case 6:
    case 0x10:
      uVar10 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_ << 3;
      break;
    case 2:
    case 7:
    case 0xf:
      uVar10 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_ << 2;
      break;
    case 3:
      uVar12 = ((this->field_0).repeated_int32_value)->current_size_;
      uVar8 = 0;
      uVar9 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar9 = uVar8;
      }
      uVar10 = 0;
      for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        uVar14 = *(ulong *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                           uVar8 * 8) | 1;
        lVar7 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        uVar10 = uVar10 + ((int)lVar7 * 9 + 0x49U >> 6);
      }
      break;
    case 4:
      uVar12 = ((this->field_0).repeated_int32_value)->current_size_;
      uVar8 = 0;
      uVar9 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar9 = uVar8;
      }
      uVar10 = 0;
      for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        uVar14 = *(ulong *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                           uVar8 * 8) | 1;
        lVar7 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        uVar10 = uVar10 + ((int)lVar7 * 9 + 0x49U >> 6);
      }
      break;
    case 5:
      uVar10 = 0;
      for (lVar7 = 0; lVar7 < ((this->field_0).repeated_int32_value)->current_size_;
          lVar7 = lVar7 + 1) {
        sVar11 = io::CodedOutputStream::VarintSize32SignExtended
                           (*(int32 *)((long)((this->field_0).repeated_int32_value)->
                                             arena_or_elements_ + lVar7 * 4));
        uVar10 = uVar10 + sVar11;
      }
      break;
    case 8:
      uVar10 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_;
      break;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
      LogMessage::LogMessage
                (&LStack_58,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x646);
      other = LogMessage::operator<<(&LStack_58,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&LStack_59,other);
      LogMessage::~LogMessage(&LStack_58);
    default:
      this->cached_size = 0;
      return 0;
    case 0xd:
      uVar12 = ((this->field_0).repeated_int32_value)->current_size_;
      uVar8 = 0;
      uVar9 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar9 = uVar8;
      }
      uVar10 = 0;
      for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        uVar12 = *(uint *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                          uVar8 * 4) | 1;
        iVar2 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar10 = uVar10 + (iVar2 * 9 + 0x49U >> 6);
      }
      break;
    case 0xe:
      uVar10 = 0;
      for (lVar7 = 0; lVar7 < ((this->field_0).repeated_int32_value)->current_size_;
          lVar7 = lVar7 + 1) {
        sVar11 = io::CodedOutputStream::VarintSize32SignExtended
                           (*(int32 *)((long)((this->field_0).repeated_int32_value)->
                                             arena_or_elements_ + lVar7 * 4));
        uVar10 = uVar10 + sVar11;
      }
      break;
    case 0x11:
      uVar10 = 0;
      for (lVar7 = 0; lVar7 < ((this->field_0).repeated_int32_value)->current_size_;
          lVar7 = lVar7 + 1) {
        sVar11 = WireFormatLite::SInt32Size
                           (*(int32 *)((long)((this->field_0).repeated_int32_value)->
                                             arena_or_elements_ + lVar7 * 4));
        uVar10 = uVar10 + sVar11;
      }
      break;
    case 0x12:
      uVar10 = 0;
      for (lVar7 = 0; lVar7 < ((this->field_0).repeated_int32_value)->current_size_;
          lVar7 = lVar7 + 1) {
        sVar11 = WireFormatLite::SInt64Size
                           (*(int64 *)((long)((this->field_0).repeated_int32_value)->
                                             arena_or_elements_ + lVar7 * 8));
        uVar10 = uVar10 + sVar11;
      }
    }
    this->cached_size = (uint)uVar10;
    if (uVar10 == 0) {
      return 0;
    }
    uVar12 = (uint)uVar10 | 1;
    iVar2 = 0x1f;
    if (uVar12 != 0) {
      for (; uVar12 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar11 = (size_t)(iVar2 * 9 + 0x49U >> 6);
    uVar12 = number * 8 + 3;
    iVar2 = 0x1f;
    if (uVar12 != 0) {
      for (; uVar12 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar3 = uVar10 + (iVar2 * 9 + 0x49U >> 6);
    goto LAB_0028d2b3;
  }
  if ((this->field_0xa & 1) != 0) {
    return 0;
  }
  uVar13 = (uint64)this->type;
  sVar3 = WireFormatLite::TagSize(number,(uint)this->type);
  switch(this->type) {
  case '\x01':
  case '\x06':
  case '\x10':
    return sVar3 + 8;
  case '\x02':
  case '\a':
  case '\x0f':
    return sVar3 + 4;
  case '\x03':
  case '\x04':
    uVar10 = (this->field_0).uint64_value | 1;
    lVar7 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    iVar2 = (int)lVar7;
    goto LAB_0028d2aa;
  case '\x05':
  case '\x0e':
    sVar11 = io::CodedOutputStream::VarintSize32SignExtended((this->field_0).int32_value);
    break;
  case '\b':
    return sVar3 + 1;
  case '\t':
    sVar11 = WireFormatLite::StringSize((this->field_0).string_value);
    break;
  case '\n':
    sVar11 = (**(code **)(*(long *)(this->field_0).repeated_string_value + 0x58))
                       ((type_info *)(this->field_0).repeated_string_value,uVar13,extraout_RDX);
    break;
  case '\v':
    if ((this->field_0xa & 0x10) != 0) {
      uVar12 = (*((this->field_0).message_value)->_vptr_MessageLite[10])();
      sVar3 = sVar3 + (long)(int)uVar12;
      goto LAB_0028d2a4;
    }
    sVar11 = WireFormatLite::MessageSize<google::protobuf::MessageLite>
                       ((this->field_0).message_value);
    break;
  case '\f':
    sVar11 = WireFormatLite::BytesSize((this->field_0).string_value);
    break;
  case '\r':
    uVar12 = (this->field_0).uint32_value;
LAB_0028d2a4:
    iVar2 = 0x1f;
    if ((uVar12 | 1) != 0) {
      for (; (uVar12 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
LAB_0028d2aa:
    sVar11 = (size_t)(iVar2 * 9 + 0x49U >> 6);
    break;
  case '\x11':
    sVar11 = WireFormatLite::SInt32Size((this->field_0).int32_value);
    break;
  case '\x12':
    sVar11 = WireFormatLite::SInt64Size((this->field_0).int64_value);
    break;
  default:
    goto switchD_0028cdc5_default;
  }
LAB_0028d2b3:
  sVar3 = sVar3 + sVar11;
switchD_0028cdc5_default:
  return sVar3;
}

Assistant:

size_t ExtensionSet::Extension::MessageSetItemByteSize(int number) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but compute the byte size for it the
    // normal way.
    return ByteSize(number);
  }

  if (is_cleared) return 0;

  size_t our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(number);

  // message
  size_t message_size = 0;
  if (is_lazy) {
    message_size = lazymessage_value->ByteSizeLong();
  } else {
    message_size = message_value->ByteSizeLong();
  }

  our_size += io::CodedOutputStream::VarintSize32(message_size);
  our_size += message_size;

  return our_size;
}